

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O0

void Cec2_ManSimAlloc(Gia_Man_t *p,int nWords)

{
  int iVar1;
  Vec_Wrd_t *pVVar2;
  int nWords_local;
  Gia_Man_t *p_local;
  
  Vec_WrdFreeP(&p->vSims);
  Vec_WrdFreeP(&p->vSimsPi);
  iVar1 = Gia_ManObjNum(p);
  pVVar2 = Vec_WrdStart(iVar1 * nWords);
  p->vSims = pVVar2;
  iVar1 = Gia_ManCiNum(p);
  pVVar2 = Vec_WrdAlloc(iVar1 * nWords * 4);
  p->vSimsPi = pVVar2;
  p->nSimWords = nWords;
  return;
}

Assistant:

void Cec2_ManSimAlloc( Gia_Man_t * p, int nWords )
{
    Vec_WrdFreeP( &p->vSims );
    Vec_WrdFreeP( &p->vSimsPi );
    p->vSims   = Vec_WrdStart( Gia_ManObjNum(p) * nWords );
    p->vSimsPi = Vec_WrdAlloc( Gia_ManCiNum(p) * nWords * 4 ); // storage for CI patterns
    p->nSimWords = nWords;
}